

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O0

void luaK_storevar(FuncState *fs,expdesc *var,expdesc *ex)

{
  expkind eVar1;
  OpCode o;
  int iVar2;
  int iVar3;
  OpCode local_2c;
  int e_1;
  OpCode op_1;
  OpCode op;
  int e;
  expdesc *ex_local;
  expdesc *var_local;
  FuncState *fs_local;
  
  eVar1 = var->k;
  if (eVar1 == VLOCAL) {
    check_valid_store(fs,var,ex);
    freeexp(fs,ex);
    exp2reg(fs,ex,(var->u).info);
  }
  else {
    if (eVar1 == VUPVAL) {
      iVar2 = luaK_exp2anyreg(fs,ex);
      o = check_valid_setupval(fs,var,ex,iVar2);
      luaK_codeABC(fs,o,iVar2,(var->u).info,0);
    }
    else {
      if (eVar1 != VINDEXED) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lcode.c"
                      ,0x429,"void luaK_storevar(FuncState *, expdesc *, expdesc *)");
      }
      iVar2 = luaK_exp2RK(fs,ex);
      if ((var->u).ind.vt == '\b') {
        if ((var->u).ind.key_ravi_type_map == 8) {
          if (var->ravi_type_map == 0x40) {
            local_2c = OP_RAVI_FARRAY_SET;
            if (ex->ravi_type_map == 0x10) {
              local_2c = OP_RAVI_FARRAY_SETF;
            }
          }
          else if (var->ravi_type_map == 0x20) {
            local_2c = OP_RAVI_IARRAY_SET;
            if (ex->ravi_type_map == 8) {
              local_2c = OP_RAVI_IARRAY_SETI;
            }
          }
          else {
            local_2c = OP_RAVI_SETI;
          }
        }
        else if (((var->u).ind.key_ravi_type_map == 0x100) &&
                (iVar3 = isshortstr(fs,(int)(var->u).ind.idx), iVar3 != 0)) {
          local_2c = OP_RAVI_SETFIELD;
          if (var->ravi_type_map == 0x80) {
            local_2c = OP_RAVI_TABLE_SETFIELD;
          }
        }
        else {
          local_2c = OP_SETTABLE;
        }
      }
      else {
        local_2c = OP_SETTABUP;
      }
      luaK_codeABC(fs,local_2c,(uint)(var->u).ind.t,(int)(var->u).ind.idx,iVar2);
    }
    freeexp(fs,ex);
  }
  return;
}

Assistant:

void luaK_storevar (FuncState *fs, expdesc *var, expdesc *ex) {
  switch (var->k) {
    case VLOCAL: {
      check_valid_store(fs, var, ex);
      freeexp(fs, ex);
      exp2reg(fs, ex, var->u.info);  /* compute 'ex' into proper place */
      return;
    }
    case VUPVAL: {
      int e = luaK_exp2anyreg(fs, ex);
      OpCode op = check_valid_setupval(fs, var, ex, e);
      luaK_codeABC(fs, op, e, var->u.info, 0);
      break;
    }
    case VINDEXED: {
      OpCode op;
      int e = luaK_exp2RK(fs, ex);
      if (var->u.ind.vt == VLOCAL) {
        /* table value set - if array access then use specialized versions */
        if (var->u.ind.key_ravi_type_map == RAVI_TM_INTEGER) {
          if (var->ravi_type_map == RAVI_TM_FLOAT_ARRAY) {
                op = ex->ravi_type_map == RAVI_TM_FLOAT ? OP_RAVI_FARRAY_SETF : OP_RAVI_FARRAY_SET;
          } else if (var->ravi_type_map == RAVI_TM_INTEGER_ARRAY) {
                op = ex->ravi_type_map == RAVI_TM_INTEGER ? OP_RAVI_IARRAY_SETI : OP_RAVI_IARRAY_SET;
          } else {
            op = OP_RAVI_SETI;
          }
        } else if (var->u.ind.key_ravi_type_map == RAVI_TM_STRING && isshortstr(fs, var->u.ind.idx)) {
          op = var->ravi_type_map == RAVI_TM_TABLE ? OP_RAVI_TABLE_SETFIELD : OP_RAVI_SETFIELD;
        } else {
          op = OP_SETTABLE;
        }
      } else {
        op = OP_SETTABUP;
      }
      luaK_codeABC(fs, op, var->u.ind.t, var->u.ind.idx, e);
      break;
    }
    default: lua_assert(0);  /* invalid var kind to store */
  }
  freeexp(fs, ex);
}